

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SyncLabelCase::iterate(SyncLabelCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  deUint32 err;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_380;
  MessageBuilder local_200;
  undefined8 local_80;
  GLsync sync;
  char buffer [64];
  char *pcStack_30;
  int outlen;
  char *msg;
  Functions *gl;
  SyncLabelCase *local_10;
  SyncLabelCase *this_local;
  
  local_10 = this;
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = isKHRDebugSupported((this->super_TestCase).m_context), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      msg = (char *)CONCAT44(extraout_var,iVar3);
      pcStack_30 = "This is a debug label";
      buffer[0x3c] = -1;
      buffer[0x3d] = -1;
      buffer[0x3e] = -1;
      buffer[0x3f] = -1;
      local_80 = (**(code **)(msg + 0x640))(0x9117,0);
      err = (**(code **)(msg + 0x800))();
      glu::checkError(err,"fenceSync",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                      ,0x730);
      (**(code **)(msg + 0xfc8))(local_80,0xffffffff,"This is a debug label");
      deMemset(&sync,0x58,0x40);
      (**(code **)(msg + 0x960))(local_80,0x40,buffer + 0x3c,&sync);
      if (buffer._60_4_ == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Failed to query debug label from object");
      }
      else {
        dVar2 = deStringEqual("This is a debug label",(char *)&sync);
        if (dVar2 == 0) {
          buffer[0x37] = '\0';
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_380,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_380,(char (*) [40])"Query returned wrong string: expected \"");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xffffffffffffffd0);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"\" but got \"");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&sync);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf09e4c);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_380);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Query returned wrong label");
        }
        else {
          pTVar5 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_200,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_200,(char (*) [25])"Query returned string: \"");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [64])&sync);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf09e4c);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_200);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
        }
      }
      (**(code **)(msg + 0x478))(local_80);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x728);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

SyncLabelCase::IterateResult SyncLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	char					buffer[64];

	glw::GLsync				sync		= gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "fenceSync");

	gl.objectPtrLabel(sync, -1, msg);

	deMemset(buffer, 'X', sizeof(buffer));
	gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);

	if (outlen == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to query debug label from object");
	else if (deStringEqual(msg, buffer))
	{
		m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		buffer[63] = '\0'; // make sure buffer is null terminated before printing
		m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << msg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query returned wrong label");
	}

	gl.deleteSync(sync);

	return STOP;
}